

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

bool __thiscall
VmaDefragmentationContext_T::ComputeDefragmentation_Extensive
          (VmaDefragmentationContext_T *this,VmaBlockVector *vector,size_t index)

{
  byte bVar1;
  VmaBlockMetadata *pVVar2;
  bool bVar3;
  int iVar4;
  CounterStatus CVar5;
  byte *index_00;
  VmaDefragmentationContext_T *this_00;
  VmaBlockVector *pVVar6;
  VmaDeviceMemoryBlock *pVVar7;
  undefined4 extraout_var;
  VkDeviceSize bytes;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_t sVar9;
  undefined1 *puVar10;
  size_t sVar11;
  size_t sVar12;
  VmaBlockVector *in_RDX;
  VmaDefragmentationContext_T *in_RSI;
  VmaDefragmentationContext_T *in_RDI;
  size_t i_1;
  size_t prevMoveCount_1;
  size_t i;
  MoveAllocationData moveData;
  VmaAllocHandle handle;
  size_t prevMoveCount;
  VmaBlockMetadata *freeMetadata;
  size_t last;
  bool otherPresent;
  bool bufferPresent;
  bool texturePresent;
  StateExtensive *vectorState;
  byte *in_stack_fffffffffffffef8;
  VmaBlockVector *in_stack_ffffffffffffff00;
  VmaBlockMetadata *in_stack_ffffffffffffff08;
  VmaAllocHandle in_stack_ffffffffffffff10;
  VmaBlockVector *in_stack_ffffffffffffff18;
  ulong uVar13;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  size_t in_stack_ffffffffffffff28;
  size_t in_stack_ffffffffffffff30;
  VmaDefragmentationContext_T *in_stack_ffffffffffffff38;
  VmaBlockVector *in_stack_ffffffffffffff50;
  VmaBlockVector *vector_00;
  ulong local_98;
  bool *in_stack_ffffffffffffff70;
  bool *in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  VmaBlockVector *in_stack_ffffffffffffff88;
  VmaSuballocationType in_stack_ffffffffffffff94;
  VmaDefragmentationContext_T *in_stack_ffffffffffffff98;
  VmaBlockVector *in_stack_ffffffffffffffa0;
  VmaDefragmentationContext_T *in_stack_ffffffffffffffa8;
  VmaBlockVector *in_stack_ffffffffffffffb0;
  VmaDefragmentationContext_T *in_stack_ffffffffffffffb8;
  byte local_2b;
  byte local_2a;
  byte local_29;
  long lVar8;
  
  if ((in_RSI->m_Moves).m_Capacity == 1) {
    bVar3 = ComputeDefragmentation_Full(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    return bVar3;
  }
  index_00 = (byte *)((long)in_RDI->m_AlgorithmState + (long)in_RDX * 0x10);
  local_29 = 0;
  local_2a = 0;
  local_2b = 0;
  this_00 = (VmaDefragmentationContext_T *)(ulong)*index_00;
  switch(this_00) {
  case (VmaDefragmentationContext_T *)0x0:
  case (VmaDefragmentationContext_T *)0x1:
  case (VmaDefragmentationContext_T *)0x2:
    if (*(long *)(index_00 + 8) == 0) {
      *index_00 = 6;
      bVar3 = ComputeDefragmentation_Fast(this_00,in_stack_ffffffffffffff50);
      return bVar3;
    }
    if (*(long *)(index_00 + 8) == -1) {
      pVVar6 = (VmaBlockVector *)VmaBlockVector::GetBlockCount((VmaBlockVector *)0x2faca8);
    }
    else {
      pVVar6 = *(VmaBlockVector **)(index_00 + 8);
    }
    puVar10 = &pVVar6[-1].field_0xb7;
    vector_00 = pVVar6;
    pVVar7 = VmaBlockVector::GetBlock(in_stack_ffffffffffffff00,(size_t)in_stack_fffffffffffffef8);
    pVVar2 = pVVar7->m_pMetadata;
    sVar11 = VmaVector<VmaDefragmentationMove,_VmaStlAllocator<VmaDefragmentationMove>_>::size
                       (&in_RDI->m_Moves);
    iVar4 = (*pVVar2->_vptr_VmaBlockMetadata[0xb])();
    lVar8 = CONCAT44(extraout_var,iVar4);
    while (lVar8 != 0) {
      GetMoveData(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      bytes = VmaAllocation_T::GetSize((VmaAllocation_T *)in_stack_ffffffffffffffa0);
      CVar5 = CheckCounters(in_RDI,bytes);
      if (CVar5 == Pass) {
LAB_002fad9b:
        bVar3 = AllocInOtherBlock(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                                  in_stack_ffffffffffffff28,
                                  (MoveAllocationData *)
                                  CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                                  in_stack_ffffffffffffff18);
        if (bVar3) {
          sVar12 = VmaVector<VmaDefragmentationMove,_VmaStlAllocator<VmaDefragmentationMove>_>::size
                             (&in_RDI->m_Moves);
          if ((sVar11 != sVar12) &&
             (iVar4 = (*pVVar2->_vptr_VmaBlockMetadata[0xc])(pVVar2,lVar8),
             CONCAT44(extraout_var_00,iVar4) == 0)) {
            *(undefined1 **)((long)in_RDI->m_AlgorithmState + (long)in_RDX * 8) = puVar10;
          }
          return true;
        }
      }
      else if (CVar5 != Ignore) {
        if (CVar5 == End) {
          return true;
        }
        goto LAB_002fad9b;
      }
      iVar4 = (*pVVar2->_vptr_VmaBlockMetadata[0xc])(pVVar2,lVar8);
      lVar8 = CONCAT44(extraout_var_01,iVar4);
    }
    sVar12 = sVar11;
    sVar9 = VmaVector<VmaDefragmentationMove,_VmaStlAllocator<VmaDefragmentationMove>_>::size
                      (&in_RDI->m_Moves);
    if (sVar11 != sVar9) {
      bVar1 = *index_00;
      if (bVar1 == 0) {
        *index_00 = 3;
      }
      else if ((bVar1 == 1) || (bVar1 != 2)) {
        *index_00 = 4;
      }
      else {
        *index_00 = 5;
      }
      *(undefined1 **)(index_00 + 8) = puVar10;
      bVar3 = ComputeDefragmentation_Extensive(in_RSI,in_RDX,(size_t)index_00);
      return bVar3;
    }
    if (puVar10 != (undefined1 *)0x0) {
      for (puVar10 = &pVVar6[-1].field_0xb6; puVar10 != (undefined1 *)0x0; puVar10 = puVar10 + -1) {
        VmaBlockVector::GetBlock(in_stack_ffffffffffffff00,(size_t)in_stack_fffffffffffffef8);
        bVar3 = ReallocWithinBlock(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                                   (VmaDeviceMemoryBlock *)in_stack_ffffffffffffff98);
        if (bVar3) {
          return true;
        }
      }
    }
    sVar11 = VmaVector<VmaDefragmentationMove,_VmaStlAllocator<VmaDefragmentationMove>_>::size
                       (&in_RDI->m_Moves);
    if (sVar12 == sVar11) {
      bVar3 = ComputeDefragmentation_Fast(this_00,vector_00);
      return bVar3;
    }
    break;
  case (VmaDefragmentationContext_T *)0x4:
    in_stack_fffffffffffffef8 = &local_2b;
    bVar3 = MoveDataToFreeBlocks
                      (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,in_stack_ffffffffffffff88
                       ,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                       in_stack_ffffffffffffff70,(bool *)in_stack_ffffffffffffffb0);
    if (!bVar3) break;
    if ((local_29 & 1) != 0) {
      *index_00 = 1;
      bVar3 = ComputeDefragmentation_Extensive(in_RSI,in_RDX,(size_t)index_00);
      return bVar3;
    }
    if (((local_2a & 1) == 0) && ((local_2b & 1) == 0)) {
      *index_00 = 6;
      break;
    }
    *index_00 = 3;
  case (VmaDefragmentationContext_T *)0x3:
    local_2a = 0;
    local_2b = 0;
    in_stack_fffffffffffffef8 = &local_2b;
    bVar3 = MoveDataToFreeBlocks
                      (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,in_stack_ffffffffffffff88
                       ,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                       in_stack_ffffffffffffff70,(bool *)in_stack_ffffffffffffffb0);
    if (bVar3) {
      if ((local_2a & 1) != 0) {
        *index_00 = 0;
        bVar3 = ComputeDefragmentation_Extensive(in_RSI,in_RDX,(size_t)index_00);
        return bVar3;
      }
      if ((local_2b & 1) == 0) {
        *index_00 = 6;
      }
      else {
        *index_00 = 5;
switchD_002fac43_caseD_5:
        local_2b = 0;
        in_stack_fffffffffffffef8 = &local_2b;
        bVar3 = MoveDataToFreeBlocks
                          (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                           in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                           in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                           (bool *)in_stack_ffffffffffffffb0);
        if (bVar3) {
          if ((local_2b & 1) != 0) {
            *index_00 = 0;
            bVar3 = ComputeDefragmentation_Extensive(in_RSI,in_RDX,(size_t)index_00);
            return bVar3;
          }
          *index_00 = 6;
        }
      }
    }
    break;
  case (VmaDefragmentationContext_T *)0x5:
    goto switchD_002fac43_caseD_5;
  case (VmaDefragmentationContext_T *)0x6:
    break;
  case (VmaDefragmentationContext_T *)0x7:
    return false;
  }
  if (*index_00 == 6) {
    sVar11 = VmaVector<VmaDefragmentationMove,_VmaStlAllocator<VmaDefragmentationMove>_>::size
                       (&in_RDI->m_Moves);
    local_98 = 0;
    while (uVar13 = local_98, sVar12 = VmaBlockVector::GetBlockCount((VmaBlockVector *)0x2fb249),
          uVar13 < sVar12) {
      VmaBlockVector::GetBlock(in_stack_ffffffffffffff00,(size_t)in_stack_fffffffffffffef8);
      bVar3 = ReallocWithinBlock(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                                 (VmaDeviceMemoryBlock *)in_stack_ffffffffffffff98);
      if (bVar3) {
        return true;
      }
      local_98 = local_98 + 1;
    }
    sVar12 = VmaVector<VmaDefragmentationMove,_VmaStlAllocator<VmaDefragmentationMove>_>::size
                       (&in_RDI->m_Moves);
    if (sVar11 == sVar12) {
      *index_00 = 7;
    }
  }
  return false;
}

Assistant:

bool VmaDefragmentationContext_T::ComputeDefragmentation_Extensive(VmaBlockVector& vector, size_t index)
{
    // First free single block, then populate it to the brim, then free another block, and so on

    // Fallback to previous algorithm since without granularity conflicts it can achieve max packing
    if (vector.m_BufferImageGranularity == 1)
        return ComputeDefragmentation_Full(vector);

    VMA_ASSERT(m_AlgorithmState != VMA_NULL);

    StateExtensive& vectorState = reinterpret_cast<StateExtensive*>(m_AlgorithmState)[index];

    bool texturePresent = false, bufferPresent = false, otherPresent = false;
    switch (vectorState.operation)
    {
    case StateExtensive::Operation::Done: // Vector defragmented
        return false;
    case StateExtensive::Operation::FindFreeBlockBuffer:
    case StateExtensive::Operation::FindFreeBlockTexture:
    case StateExtensive::Operation::FindFreeBlockAll:
    {
        // No more blocks to free, just perform fast realloc and move to cleanup
        if (vectorState.firstFreeBlock == 0)
        {
            vectorState.operation = StateExtensive::Operation::Cleanup;
            return ComputeDefragmentation_Fast(vector);
        }

        // No free blocks, have to clear last one
        size_t last = (vectorState.firstFreeBlock == SIZE_MAX ? vector.GetBlockCount() : vectorState.firstFreeBlock) - 1;
        VmaBlockMetadata* freeMetadata = vector.GetBlock(last)->m_pMetadata;

        const size_t prevMoveCount = m_Moves.size();
        for (VmaAllocHandle handle = freeMetadata->GetAllocationListBegin();
            handle != VK_NULL_HANDLE;
            handle = freeMetadata->GetNextAllocation(handle))
        {
            MoveAllocationData moveData = GetMoveData(handle, freeMetadata);
            switch (CheckCounters(moveData.move.srcAllocation->GetSize()))
            {
            case CounterStatus::Ignore:
                continue;
            case CounterStatus::End:
                return true;
            default:
                VMA_ASSERT(0);
            case CounterStatus::Pass:
                break;
            }

            // Check all previous blocks for free space
            if (AllocInOtherBlock(0, last, moveData, vector))
            {
                // Full clear performed already
                if (prevMoveCount != m_Moves.size() && freeMetadata->GetNextAllocation(handle) == VK_NULL_HANDLE)
                    reinterpret_cast<size_t*>(m_AlgorithmState)[index] = last;
                return true;
            }
        }

        if (prevMoveCount == m_Moves.size())
        {
            // Cannot perform full clear, have to move data in other blocks around
            if (last != 0)
            {
                for (size_t i = last - 1; i; --i)
                {
                    if (ReallocWithinBlock(vector, vector.GetBlock(i)))
                        return true;
                }
            }

            if (prevMoveCount == m_Moves.size())
            {
                // No possible reallocs within blocks, try to move them around fast
                return ComputeDefragmentation_Fast(vector);
            }
        }
        else
        {
            switch (vectorState.operation)
            {
            case StateExtensive::Operation::FindFreeBlockBuffer:
                vectorState.operation = StateExtensive::Operation::MoveBuffers;
                break;
            default:
                VMA_ASSERT(0);
            case StateExtensive::Operation::FindFreeBlockTexture:
                vectorState.operation = StateExtensive::Operation::MoveTextures;
                break;
            case StateExtensive::Operation::FindFreeBlockAll:
                vectorState.operation = StateExtensive::Operation::MoveAll;
                break;
            }
            vectorState.firstFreeBlock = last;
            // Nothing done, block found without reallocations, can perform another reallocs in same pass
            return ComputeDefragmentation_Extensive(vector, index);
        }
        break;
    }
    case StateExtensive::Operation::MoveTextures:
    {
        if (MoveDataToFreeBlocks(VMA_SUBALLOCATION_TYPE_IMAGE_OPTIMAL, vector,
            vectorState.firstFreeBlock, texturePresent, bufferPresent, otherPresent))
        {
            if (texturePresent)
            {
                vectorState.operation = StateExtensive::Operation::FindFreeBlockTexture;
                return ComputeDefragmentation_Extensive(vector, index);
            }

            if (!bufferPresent && !otherPresent)
            {
                vectorState.operation = StateExtensive::Operation::Cleanup;
                break;
            }

            // No more textures to move, check buffers
            vectorState.operation = StateExtensive::Operation::MoveBuffers;
            bufferPresent = false;
            otherPresent = false;
        }
        else
            break;
    }
    case StateExtensive::Operation::MoveBuffers:
    {
        if (MoveDataToFreeBlocks(VMA_SUBALLOCATION_TYPE_BUFFER, vector,
            vectorState.firstFreeBlock, texturePresent, bufferPresent, otherPresent))
        {
            if (bufferPresent)
            {
                vectorState.operation = StateExtensive::Operation::FindFreeBlockBuffer;
                return ComputeDefragmentation_Extensive(vector, index);
            }

            if (!otherPresent)
            {
                vectorState.operation = StateExtensive::Operation::Cleanup;
                break;
            }

            // No more buffers to move, check all others
            vectorState.operation = StateExtensive::Operation::MoveAll;
            otherPresent = false;
        }
        else
            break;
    }
    case StateExtensive::Operation::MoveAll:
    {
        if (MoveDataToFreeBlocks(VMA_SUBALLOCATION_TYPE_FREE, vector,
            vectorState.firstFreeBlock, texturePresent, bufferPresent, otherPresent))
        {
            if (otherPresent)
            {
                vectorState.operation = StateExtensive::Operation::FindFreeBlockBuffer;
                return ComputeDefragmentation_Extensive(vector, index);
            }
            // Everything moved
            vectorState.operation = StateExtensive::Operation::Cleanup;
        }
        break;
    }
    case StateExtensive::Operation::Cleanup:
        // Cleanup is handled below so that other operations may reuse the cleanup code. This case is here to prevent the unhandled enum value warning (C4062).
        break;
    }

    if (vectorState.operation == StateExtensive::Operation::Cleanup)
    {
        // All other work done, pack data in blocks even tighter if possible
        const size_t prevMoveCount = m_Moves.size();
        for (size_t i = 0; i < vector.GetBlockCount(); ++i)
        {
            if (ReallocWithinBlock(vector, vector.GetBlock(i)))
                return true;
        }

        if (prevMoveCount == m_Moves.size())
            vectorState.operation = StateExtensive::Operation::Done;
    }
    return false;
}